

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O3

void icetImageAdjustForInput(IceTImage image)

{
  IceTEnum depth_format;
  IceTEnum color_format;
  IceTEnum local_20;
  IceTEnum local_1c;
  
  if (image.opaque_internals != (IceTVoid *)0x0) {
    icetGetEnumv(9,&local_1c);
    icetGetEnumv(10,&local_20);
    *(IceTEnum *)((long)image.opaque_internals + 4) = local_1c;
    *(IceTEnum *)((long)image.opaque_internals + 8) = local_20;
    icetImageSetDimensions
              (image,*(IceTSizeType *)((long)image.opaque_internals + 0xc),
               *(IceTSizeType *)((long)image.opaque_internals + 0x10));
  }
  return;
}

Assistant:

void icetImageAdjustForInput(IceTImage image)
{
    IceTEnum color_format, depth_format;

    if (icetImageIsNull(image)) return;

    ICET_TEST_IMAGE_HEADER(image);

    icetGetEnumv(ICET_COLOR_FORMAT, &color_format);
    icetGetEnumv(ICET_DEPTH_FORMAT, &depth_format);

  /* Reset to the specified image format. */
    ICET_IMAGE_HEADER(image)[ICET_IMAGE_COLOR_FORMAT_INDEX] = color_format;
    ICET_IMAGE_HEADER(image)[ICET_IMAGE_DEPTH_FORMAT_INDEX] = depth_format;

  /* Reset the image size (changes actual buffer size). */
    icetImageSetDimensions(image,
                           icetImageGetWidth(image),
                           icetImageGetHeight(image));
}